

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Bounds3f * __thiscall pbrt::Cylinder::Bounds(Bounds3f *__return_storage_ptr__,Cylinder *this)

{
  Float FVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Bounds3f local_20;
  
  FVar1 = this->radius;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar4 = vxorps_avx512vl(ZEXT416((uint)FVar1),auVar2);
  auVar2 = vminss_avx(ZEXT416((uint)FVar1),auVar4);
  auVar3 = vminss_avx(ZEXT416((uint)this->zMax),ZEXT416((uint)this->zMin));
  auVar5._0_4_ = auVar2._0_4_;
  auVar5._4_4_ = auVar5._0_4_;
  auVar5._8_4_ = auVar5._0_4_;
  auVar5._12_4_ = auVar5._0_4_;
  local_20.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar5);
  local_20.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar3._0_4_;
  auVar2 = vmaxss_avx(ZEXT416((uint)FVar1),auVar4);
  auVar3 = vmaxss_avx(ZEXT416((uint)this->zMax),ZEXT416((uint)this->zMin));
  auVar4._0_4_ = auVar2._0_4_;
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  local_20.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar4);
  local_20.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar3._0_4_;
  Transform::operator()(__return_storage_ptr__,this->renderFromObject,&local_20);
  return __return_storage_ptr__;
}

Assistant:

Bounds3f Cylinder::Bounds() const {
    return (*renderFromObject)(
        Bounds3f(Point3f(-radius, -radius, zMin), Point3f(radius, radius, zMax)));
}